

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

void __thiscall Js::JavascriptLibrary::BeginDynamicFunctionReferences(JavascriptLibrary *this)

{
  SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> **ppSVar1;
  Recycler *pRVar2;
  SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> *this_00;
  TrackAllocData local_38;
  JavascriptLibrary *local_10;
  JavascriptLibrary *this_local;
  
  local_10 = this;
  ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_SList__
                      ((WriteBarrierPtr *)&this->dynamicFunctionReference);
  if (*ppSVar1 == (SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> *)0x0) {
    pRVar2 = this->recycler;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_38,
               (type_info *)&SList<Js::FunctionProxy*,Memory::Recycler,RealCount>::typeinfo,0,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
               ,0x1cc7);
    pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_38);
    this_00 = (SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> *)
              new<Memory::Recycler>(0x18,pRVar2,0x43c4b0);
    SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount>::SList(this_00,this->recycler);
    Memory::WriteBarrierPtr<SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount>_>::operator=
              (&this->dynamicFunctionReference,this_00);
    this->dynamicFunctionReferenceDepth = 0;
  }
  this->dynamicFunctionReferenceDepth = this->dynamicFunctionReferenceDepth + 1;
  return;
}

Assistant:

void JavascriptLibrary::BeginDynamicFunctionReferences()
    {
        if (this->dynamicFunctionReference == nullptr)
        {
            this->dynamicFunctionReference = RecyclerNew(this->recycler, FunctionReferenceList, this->recycler);
            this->dynamicFunctionReferenceDepth = 0;
        }

        this->dynamicFunctionReferenceDepth++;
    }